

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MauProxy.cpp
# Opt level: O3

void __thiscall mau::DeliveryChannel::InsertQueueNode(DeliveryChannel *this,QueueNode *node)

{
  Lock *__mutex;
  BufferAllocator *__mutex_00;
  bool bVar1;
  uint uVar2;
  uint32_t uVar3;
  DeliveryCommonData *pDVar4;
  int iVar5;
  uint64_t uVar6;
  ulong uVar7;
  QueueNode *node_00;
  byte bVar8;
  uint uVar9;
  ulong uVar10;
  undefined4 uVar11;
  uint uVar12;
  undefined4 extraout_var;
  uint64_t uVar13;
  pthread_mutex_t *__mutex_01;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  float fVar16;
  undefined1 in_ZMM0 [64];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar19 [16];
  MauChannelConfig config;
  MauChannelConfig_t local_64;
  
  auVar17 = in_ZMM1._0_16_;
  auVar18 = in_ZMM0._0_16_;
  LockedValue<MauChannelConfig_t>::Get(&local_64,&this->Common->ChannelConfig);
  __mutex = &this->InsertLock;
  iVar5 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar5 == 0) {
    uVar6 = GetTimeUsec();
    uVar2 = node->Bytes;
    auVar18 = vcvtusi2ss_avx512f(auVar18,uVar2);
    auVar15._0_4_ = auVar18._0_4_ / local_64.Router_MBPS;
    auVar15._4_12_ = auVar18._4_12_;
    uVar7 = uVar6 + local_64.LightSpeedMsec * 1000;
    uVar11 = vcvttss2usi_avx512f(auVar15);
    if (this->NextQueueSlotUsec < uVar7) {
      uVar6 = uVar7 + CONCAT44(extraout_var,uVar11);
      fVar16 = 0.0;
    }
    else {
      uVar6 = this->NextQueueSlotUsec + CONCAT44(extraout_var,uVar11);
      if (local_64.Router_QueueMsec * 1000 + uVar7 <= uVar6) {
        pDVar4 = this->Common;
        __mutex_01 = (pthread_mutex_t *)&pDVar4->ReadBufferAllocator;
        iVar5 = pthread_mutex_lock(__mutex_01);
        if (iVar5 != 0) {
          std::__throw_system_error(iVar5);
        }
        pktalloc::Allocator::Free(&(pDVar4->ReadBufferAllocator).Allocator,(uint8_t *)node);
        goto LAB_0018d0a7;
      }
      auVar15 = vcvtusi2ss_avx512f(auVar17,uVar6 - uVar7);
      auVar18 = vcvtusi2ss_avx512f(auVar17,local_64.Router_QueueMsec * 1000);
      fVar16 = auVar15._0_4_ / auVar18._0_4_;
    }
    if (((local_64.Router_RED_QueueFraction == 0.0) && (!NAN(local_64.Router_RED_QueueFraction))) ||
       (fVar16 <= local_64.Router_RED_QueueFraction)) {
      uVar7 = (this->LossRNG).State;
      uVar13 = (this->LossRNG).Inc;
    }
    else {
      uVar7 = (this->LossRNG).State;
      uVar13 = (this->LossRNG).Inc;
      uVar12 = (uint)(uVar7 >> 0x2d) ^ (uint)(uVar7 >> 0x1b);
      bVar8 = (byte)(uVar7 >> 0x3b);
      uVar7 = uVar7 * 0x5851f42d4c957f2d + uVar13;
      (this->LossRNG).State = uVar7;
      uVar9 = vcvttss2usi_avx512f(ZEXT416((uint)((((fVar16 - local_64.Router_RED_QueueFraction) *
                                                  local_64.Router_RED_MaxPLR) /
                                                 (1.0 - local_64.Router_RED_QueueFraction)) *
                                                4.2949673e+09)));
      if ((uVar12 >> bVar8 | uVar12 << 0x20 - bVar8) < uVar9) {
        pDVar4 = this->Common;
        __mutex_01 = (pthread_mutex_t *)&pDVar4->ReadBufferAllocator;
        iVar5 = pthread_mutex_lock(__mutex_01);
        if (iVar5 != 0) {
          std::__throw_system_error(iVar5);
        }
        pktalloc::Allocator::Free(&(pDVar4->ReadBufferAllocator).Allocator,(uint8_t *)node);
        goto LAB_0018d0a7;
      }
    }
    uVar10 = uVar7 * 0x5851f42d4c957f2d + uVar13;
    auVar18 = vinsertps_avx(ZEXT416((uint)(this->InBurstReorder & 1) *
                                    (int)(1.0 - local_64.OrderRate) +
                                    (uint)!(bool)(this->InBurstReorder & 1) *
                                    (int)local_64.ReorderRate),ZEXT416((uint)local_64.DuplicateRate)
                            ,0x10);
    auVar17._8_4_ = 0x4f800000;
    auVar17._0_8_ = 0x4f8000004f800000;
    auVar17._12_4_ = 0x4f800000;
    auVar14 = vmulps_avx512vl(auVar18,auVar17);
    auVar18._8_8_ = 0;
    auVar18._0_8_ = uVar10;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = uVar7;
    auVar18 = vpunpcklqdq_avx(auVar18,auVar19);
    auVar17 = vpsrlvq_avx2(auVar18,_DAT_0019b510);
    auVar15 = vpsrlvq_avx2(auVar18,_DAT_0019b520);
    auVar18 = vpsrlq_avx(auVar18,0x3b);
    auVar18 = vpshufd_avx(auVar18,0xe8);
    uVar10 = uVar10 * 0x5851f42d4c957f2d + uVar13;
    (this->LossRNG).State = uVar10;
    auVar17 = vpshufd_avx(auVar15 ^ auVar17,0xe8);
    auVar15 = vcvttps2udq_avx512vl(auVar14);
    auVar18 = vprorvd_avx512vl(auVar17,auVar18);
    uVar7 = vpcmpud_avx512vl(auVar18,auVar15,1);
    if ((uVar7 & 1) == 0) {
      local_64.ReorderMinimumLatencyMsec = 0;
      this->InBurstReorder = false;
    }
    else {
      this->InBurstReorder = true;
      if (local_64.ReorderMaximumLatencyMsec - local_64.ReorderMinimumLatencyMsec != 0) {
        uVar9 = (uint)(uVar10 >> 0x2d) ^ (uint)(uVar10 >> 0x1b);
        bVar8 = (byte)(uVar10 >> 0x3b);
        uVar10 = uVar10 * 0x5851f42d4c957f2d + uVar13;
        (this->LossRNG).State = uVar10;
        local_64.ReorderMinimumLatencyMsec =
             local_64.ReorderMinimumLatencyMsec +
             (uVar9 >> bVar8 | uVar9 << 0x20 - bVar8) %
             (local_64.ReorderMaximumLatencyMsec - local_64.ReorderMinimumLatencyMsec);
      }
    }
    bVar1 = this->InBurstLoss;
    uVar12 = (uint)(uVar10 >> 0x2d) ^ (uint)(uVar10 >> 0x1b);
    bVar8 = (byte)(uVar10 >> 0x3b);
    uVar10 = uVar10 * 0x5851f42d4c957f2d + uVar13;
    (this->LossRNG).State = uVar10;
    uVar9 = vcvttss2usi_avx512f(ZEXT416((uint)((float)((uint)(bVar1 & 1) *
                                                       (int)(1.0 - local_64.DeliveryRate) +
                                                      (uint)!(bool)(bVar1 & 1) *
                                                      (int)local_64.LossRate) * 4.2949673e+09)));
    if ((uVar12 >> bVar8 | uVar12 << 0x20 - bVar8) < uVar9) {
      this->InBurstLoss = true;
      pDVar4 = this->Common;
      __mutex_01 = (pthread_mutex_t *)&pDVar4->ReadBufferAllocator;
      iVar5 = pthread_mutex_lock(__mutex_01);
      if (iVar5 != 0) {
        std::__throw_system_error(iVar5);
      }
      pktalloc::Allocator::Free(&(pDVar4->ReadBufferAllocator).Allocator,(uint8_t *)node);
LAB_0018d0a7:
      pthread_mutex_unlock(__mutex_01);
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      return;
    }
    this->InBurstLoss = false;
    uVar12 = (uint)(uVar10 >> 0x2d) ^ (uint)(uVar10 >> 0x1b);
    bVar8 = (byte)(uVar10 >> 0x3b);
    uVar10 = uVar10 * 0x5851f42d4c957f2d + uVar13;
    (this->LossRNG).State = uVar10;
    uVar9 = vcvttss2usi_avx512f(ZEXT416((uint)(local_64.CorruptionRate * 4.2949673e+09)));
    if ((uVar12 >> bVar8 | uVar12 << 0x20 - bVar8) < uVar9) {
      uVar9 = (uint)(uVar10 >> 0x2d) ^ (uint)(uVar10 >> 0x1b);
      bVar8 = (byte)(uVar10 >> 0x3b);
      (this->LossRNG).State = uVar10 * 0x5851f42d4c957f2d + uVar13;
      node->Data[(ulong)(uVar9 >> bVar8 | uVar9 << 0x20 - bVar8) % (ulong)uVar2] =
           node->Data[(ulong)(uVar9 >> bVar8 | uVar9 << 0x20 - bVar8) % (ulong)uVar2] ^ 8;
    }
    if (local_64.ReorderMinimumLatencyMsec == 0) {
      this->NextQueueSlotUsec = uVar6;
    }
    else {
      uVar6 = uVar6 + local_64.ReorderMinimumLatencyMsec * 1000;
    }
    node->DeliveryUsec = uVar6;
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    iVar5 = pthread_mutex_lock((pthread_mutex_t *)&this->QueueLock);
    if (iVar5 == 0) {
      PacketQueue::InsertSorted(&this->Queue,node);
      pthread_mutex_unlock((pthread_mutex_t *)&this->QueueLock);
      if ((uVar7 & 2) != 0) {
        pDVar4 = this->Common;
        uVar3 = node->Bytes;
        __mutex_00 = &pDVar4->ReadBufferAllocator;
        iVar5 = pthread_mutex_lock((pthread_mutex_t *)__mutex_00);
        if (iVar5 != 0) goto LAB_0018d181;
        node_00 = (QueueNode *)
                  pktalloc::Allocator::Allocate
                            (&(pDVar4->ReadBufferAllocator).Allocator,uVar3 + 0x1c);
        pthread_mutex_unlock((pthread_mutex_t *)__mutex_00);
        node_00->Bytes = node->Bytes;
        memcpy(node_00->Data,node->Data,(ulong)node->Bytes);
        InsertQueueNode(this,node_00);
      }
      postNextTimer(this);
      return;
    }
  }
LAB_0018d181:
  std::__throw_system_error(iVar5);
}

Assistant:

void DeliveryChannel::InsertQueueNode(QueueNode* node)
{
    /*
        Client <-> Internet Delay <-> ISP Router Queue <-> Server

        Most queues are going to be on the receiver ISP side, for example
        on the cellphone network or cable ISP.  The Internet transmission
        delay comes before that.  Since this is the most common case for
        the protocols we are testing, we use the simplified model above.

        In this model, packets put into the queue are subjected to:
        (1) Internet Delay
        (2) ISP Router Queue

        The Internet Delay may vary on route changes.

        The Internet Service Provider (ISP) Router Queue causes
        delays and packet loss if the queue is too full.
    */

    MauChannelConfig config = Common->ChannelConfig.Get();
    bool dupe = false;

    // Hold InsertLock while processing insert
    {
        Locker locker(InsertLock);

        const uint64_t nowUsec = GetTimeUsec();

        const unsigned routerQueueUsec = config.Router_QueueMsec * 1000;
        const uint64_t routerQueueStartUsec = nowUsec + config.LightSpeedMsec * 1000;
        const unsigned dataDelayUsec = (unsigned)(node->Bytes / config.Router_MBPS);

        uint64_t deliveryUsec = 0;
        float queueFraction = 0.f;

        // Calculate delivery time based on router queue
        if (NextQueueSlotUsec < routerQueueStartUsec) {
            deliveryUsec = routerQueueStartUsec + dataDelayUsec;
        }
        else {
            deliveryUsec = NextQueueSlotUsec + dataDelayUsec;

            // DropTail if packet does not fit in router queue
            if (deliveryUsec >= routerQueueStartUsec + routerQueueUsec) {
                Common->ReadBufferAllocator.Free(node);
                return;
            }

            queueFraction = (deliveryUsec - routerQueueStartUsec) / (float)routerQueueUsec;
        }

        // If RED is triggered:
        if (config.Router_RED_QueueFraction != 0.f && queueFraction > config.Router_RED_QueueFraction)
        {
            // Rescale:
            const float red_plr = config.Router_RED_MaxPLR * (queueFraction - config.Router_RED_QueueFraction) / (1.f - config.Router_RED_QueueFraction);

            // If RED drop is needed:
            if (LossRNG.Next() < (uint32_t)(0xffffffff * red_plr)) {
                Common->ReadBufferAllocator.Free(node);
                return;
            }
        }

        // If duplicating:
        if (LossRNG.Next() < (uint32_t)(0xffffffff * config.DuplicateRate)) {
            dupe = true;
        }

        float reorderRate;
        if (InBurstReorder) {
            reorderRate = 1.f - config.OrderRate;
        }
        else {
            reorderRate = config.ReorderRate;
        }

        // If this packet will be reordered:
        unsigned reorderMsec = 0;
        if (LossRNG.Next() < (uint32_t)(0xffffffff * reorderRate))
        {
            InBurstReorder = true;
            reorderMsec = config.ReorderMinimumLatencyMsec;
            const unsigned range = config.ReorderMaximumLatencyMsec - config.ReorderMinimumLatencyMsec;
            if (range > 0) {
                reorderMsec += LossRNG.Next() % range;
            }
        }
        else {
            InBurstReorder = false;
        }

        // Select loss rate for this packet due to Gilbert-Elliott channel model
        float lossRate;
        if (InBurstLoss) {
            lossRate = 1.f - config.DeliveryRate;
        }
        else {
            lossRate = config.LossRate;
        }

        // If this packet will be lost:
        if (LossRNG.Next() < (uint32_t)(0xffffffff * lossRate)) {
            InBurstLoss = true;
            Common->ReadBufferAllocator.Free(node);
            return;
        }
        InBurstLoss = false; // Burst loss is done

        // If this packet will be corrupted:
        if (LossRNG.Next() < (uint32_t)(0xffffffff * config.CorruptionRate)) {
            node->Data[LossRNG.Next() % node->Bytes] ^= 8;
        }

        // If re-ordered:
        if (reorderMsec > 0) {
            // Add reorder time to it
            // Note: Bypasses queue so will not be counted towards channel bandwidth
            deliveryUsec += reorderMsec * 1000;
        }
        else {
            // It takes up a queue slot, so advance the queue
            NextQueueSlotUsec = deliveryUsec;
        }

        node->DeliveryUsec = deliveryUsec;
    }

    // Hold QueueLock during queue insert
    {
        Locker locker(QueueLock);
        Queue.InsertSorted(node);
    }

    if (dupe)
    {
        // Allocate space for the duplicate
        uint8_t* readBuffer = Common->ReadBufferAllocator.Allocate(kQueueHeaderSize + node->Bytes);

        QueueNode* dupeNode = reinterpret_cast<QueueNode*>(readBuffer);

        // Copy the data
        dupeNode->Bytes = node->Bytes;
        memcpy(&dupeNode->Data[0], &node->Data[0], node->Bytes);

        InsertQueueNode(dupeNode);
    }

    postNextTimer();
}